

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleConfigLoader.cpp
# Opt level: O0

bool __thiscall
SimpleConfigLoader::string2bool(SimpleConfigLoader *this,string *stringValue,bool *boolValue)

{
  int iVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  undefined1 *in_RDX;
  _func_int_int *in_RSI;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffc0;
  undefined1 local_1;
  
  __result._M_current = (char *)in_RSI;
  std::__cxx11::string::begin();
  std::__cxx11::string::end();
  __first._M_current = (char *)std::__cxx11::string::begin();
  std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
            (__first,in_stack_ffffffffffffffc0,__result,in_RSI);
  iVar1 = std::__cxx11::string::compare(__result._M_current);
  if (iVar1 == 0) {
    *in_RDX = 1;
    local_1 = true;
  }
  else {
    iVar1 = std::__cxx11::string::compare(__result._M_current);
    if (iVar1 == 0) {
      *in_RDX = 0;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool SimpleConfigLoader::string2bool(std::string stringValue, bool* boolValue)
{
	// Convert to lowercase
	std::transform(stringValue.begin(), stringValue.end(), stringValue.begin(), tolower);

	if (stringValue.compare("true") == 0)
	{
		*boolValue = true;
		return true;
	}

	if (stringValue.compare("false") == 0)
	{
		*boolValue = false;
		return true;
	}

	return false;
}